

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

SSTableHeader * SSTable::readHeader(SSTableHeader *__return_storage_ptr__,string *fileName)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this;
  uint64_t local_298;
  uint64_t maxKey;
  uint64_t minKey;
  uint64_t length;
  uint64_t timeStamp;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  ifstream local_220 [8];
  ifstream in;
  string *fileName_local;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_220,(string *)fileName,_Var2);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    read64(local_220,&length);
    read64(local_220,&minKey);
    read64(local_220,&maxKey);
    read64(local_220,&local_298);
    std::ifstream::close();
    SSTableHeader::SSTableHeader(__return_storage_ptr__,length,minKey,maxKey,local_298);
    std::ifstream::~ifstream(local_220);
    return __return_storage_ptr__;
  }
  timeStamp._7_1_ = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "readHeader: Open file ");
  std::operator+(local_250,local_270);
  std::runtime_error::runtime_error(this,(string *)local_250);
  timeStamp._7_1_ = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SSTableHeader SSTable::readHeader(const string &fileName) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readHeader: Open file " + fileName + " failed!");
  uint64_t timeStamp, length, minKey, maxKey;
  read64(in, timeStamp);
  read64(in, length);
  read64(in, minKey);
  read64(in, maxKey);
  in.close();
  return SSTableHeader(timeStamp, length, minKey, maxKey);
}